

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,size_t primID,BBox1f time_range)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  float fVar17;
  vfloat4 a0;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = time_range;
  BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = BVar1.lower;
  auVar13._4_4_ = BVar1.upper;
  fVar17 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar12 = BVar1.lower;
  auVar13 = vmovshdup_avx(auVar13);
  fVar27 = auVar13._0_4_ - fVar12;
  auVar9 = vmovshdup_avx(auVar11._0_16_);
  auVar13 = ZEXT416((uint)(fVar17 * ((time_range.lower - fVar12) / fVar27) * 1.0000002));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  auVar13 = vmaxss_avx(ZEXT816(0),auVar13);
  auVar9 = ZEXT416((uint)(fVar17 * ((auVar9._0_4_ - fVar12) / fVar27) * 0.99999976));
  auVar9 = vroundss_avx(auVar9,auVar9,10);
  auVar9 = vminss_avx(auVar9,ZEXT416((uint)fVar17));
  if ((int)auVar9._0_4_ == (int)auVar13._0_4_) {
    auVar13 = vdpps_avx(_DAT_01fb04e0,_DAT_01fb04e0,0x7f);
    auVar18 = SUB6416(ZEXT464(0xbf800000),0);
    auVar9 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar13 = vcmpps_avx(auVar9,auVar13,1);
    auVar14._0_4_ = auVar13._0_4_;
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    auVar13 = vblendvps_avx(auVar18,_DAT_01fb04e0,auVar14);
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar18 = vrsqrtss_avx(auVar9,auVar9);
    fVar17 = auVar18._0_4_;
    fVar17 = fVar17 * 1.5 - auVar9._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar15._0_4_ = auVar13._0_4_ * fVar17;
    aVar15._4_4_ = auVar13._4_4_ * fVar17;
    aVar15._8_4_ = auVar13._8_4_ * fVar17;
    aVar15._12_4_ = auVar13._12_4_ * fVar17;
    auVar19._0_4_ = aVar15._0_4_ * -0.0;
    auVar19._4_4_ = aVar15._4_4_ * -1.0;
    auVar19._8_4_ = aVar15._8_4_ * -0.0;
    auVar19._12_4_ = aVar15._12_4_ * -0.0;
    auVar13 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar13 = vfmadd231ps_fma(auVar19,_DAT_01f7b700,auVar13);
    auVar18 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar9 = vrsqrtss_avx(auVar13,auVar13);
    fVar17 = auVar9._0_4_;
    fVar17 = fVar17 * 1.5 - auVar13._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    auVar10 = _DAT_01f7b700;
  }
  else {
    iVar6 = ((int)auVar13._0_4_ + (int)auVar9._0_4_) / 2;
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar4 = pBVar3[iVar6].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[iVar6].super_RawBufferView.stride;
    lVar8 = sVar5 * uVar2;
    lVar7 = sVar5 * (uVar2 + 1);
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             tangents.items;
    sVar5 = pBVar3[iVar6].super_RawBufferView.stride;
    fVar17 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar9 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar8),
                           ZEXT416((uint)(fVar17 * *(float *)(pcVar4 + lVar8 + 0xc))),0x30);
    auVar18 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                            ZEXT416((uint)(fVar17 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
    auVar20 = vsubps_avx(auVar18,auVar9);
    auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
    lVar7 = uVar2 * sVar5;
    auVar10 = vrsqrtss_avx(auVar13,auVar13);
    fVar27 = auVar10._0_4_;
    lVar8 = sVar5 * (uVar2 + 1);
    fVar27 = fVar27 * 1.5 + auVar13._0_4_ * -0.5 * fVar27 * fVar27 * fVar27;
    auVar10._0_4_ = auVar20._0_4_ * fVar27;
    auVar10._4_4_ = auVar20._4_4_ * fVar27;
    auVar10._8_4_ = auVar20._8_4_ * fVar27;
    auVar10._12_4_ = auVar20._12_4_ * fVar27;
    if (1e-18 < auVar13._0_4_) {
      pcVar4 = pBVar3[iVar6].super_RawBufferView.ptr_ofs;
      auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                              ZEXT416((uint)(fVar17 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
      auVar20 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar8),
                              ZEXT416((uint)(fVar17 * *(float *)(pcVar4 + lVar8 + 0xc))),0x30);
      auVar28._8_4_ = 0xbeaaaaab;
      auVar28._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar28._12_4_ = 0xbeaaaaab;
      auVar21 = vfnmadd213ps_fma(auVar13,auVar28,auVar9);
      auVar13 = vfmadd213ps_fma(auVar20,auVar28,auVar18);
      auVar20._0_4_ = auVar18._0_4_ * 0.0;
      auVar20._4_4_ = auVar18._4_4_ * 0.0;
      auVar20._8_4_ = auVar18._8_4_ * 0.0;
      auVar20._12_4_ = auVar18._12_4_ * 0.0;
      auVar13 = vfmadd231ps_fma(auVar20,ZEXT816(0) << 0x20,auVar13);
      auVar18._8_4_ = 0xc0400000;
      auVar18._0_8_ = 0xc0400000c0400000;
      auVar18._12_4_ = 0xc0400000;
      auVar13 = vfnmadd231ps_fma(auVar13,auVar18,auVar21);
      auVar18 = vfmadd231ps_fma(auVar13,auVar9,auVar18);
      auVar13 = vshufps_avx(auVar18,auVar18,0xc9);
      auVar9 = vshufps_avx(auVar10,auVar10,0xc9);
      auVar21._0_4_ = auVar18._0_4_ * auVar9._0_4_;
      auVar21._4_4_ = auVar18._4_4_ * auVar9._4_4_;
      auVar21._8_4_ = auVar18._8_4_ * auVar9._8_4_;
      auVar21._12_4_ = auVar18._12_4_ * auVar9._12_4_;
      auVar13 = vfmsub231ps_fma(auVar21,auVar10,auVar13);
      auVar13 = vshufps_avx(auVar13,auVar13,0xc9);
    }
    else {
      auVar13 = ZEXT816(0x3f80000000000000);
      auVar10 = _DAT_01f7b700;
    }
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    if (1e-18 < auVar9._0_4_) {
      auVar18 = vrsqrtss_avx(auVar9,auVar9);
      fVar17 = auVar18._0_4_;
      fVar17 = fVar17 * 1.5 - auVar9._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
      aVar22._0_4_ = auVar13._0_4_ * fVar17;
      aVar22._4_4_ = auVar13._4_4_ * fVar17;
      aVar22._8_4_ = auVar13._8_4_ * fVar17;
      aVar22._12_4_ = auVar13._12_4_ * fVar17;
      auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
      auVar9 = vshufps_avx((undefined1  [16])aVar22,(undefined1  [16])aVar22,0xc9);
      auVar24._0_4_ = auVar10._0_4_ * auVar9._0_4_;
      auVar24._4_4_ = auVar10._4_4_ * auVar9._4_4_;
      auVar24._8_4_ = auVar10._8_4_ * auVar9._8_4_;
      auVar24._12_4_ = auVar10._12_4_ * auVar9._12_4_;
      auVar13 = vfmsub231ps_fma(auVar24,(undefined1  [16])aVar22,auVar13);
      auVar18 = vshufps_avx(auVar13,auVar13,0xc9);
      auVar13 = vdpps_avx(auVar18,auVar18,0x7f);
      auVar9 = vrsqrtss_avx(auVar13,auVar13);
      fVar17 = auVar9._0_4_;
      fVar17 = fVar17 * 1.5 - auVar13._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
      aVar15._0_4_ = fVar17 * auVar18._0_4_;
      aVar15._4_4_ = fVar17 * auVar18._4_4_;
      aVar15._8_4_ = fVar17 * auVar18._8_4_;
      aVar15._12_4_ = fVar17 * auVar18._12_4_;
      goto LAB_01977091;
    }
    auVar9 = vshufpd_avx(auVar10,auVar10,1);
    auVar13 = vmovshdup_avx(auVar10);
    auVar25._8_4_ = 0x80000000;
    auVar25._0_8_ = 0x8000000080000000;
    auVar25._12_4_ = 0x80000000;
    auVar23._0_4_ = auVar13._0_4_ ^ 0x80000000;
    auVar13 = vunpckhps_avx(auVar10,ZEXT816(0) << 0x40);
    auVar23._4_12_ = ZEXT812(0) << 0x20;
    auVar20 = vshufps_avx(auVar13,auVar23,0x41);
    auVar16._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
    auVar16._8_8_ = auVar9._8_8_ ^ auVar25._8_8_;
    auVar18 = vinsertps_avx(auVar16,auVar10,0x2a);
    auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar9 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar13 = vcmpps_avx(auVar9,auVar13,1);
    auVar9._0_4_ = auVar13._0_4_;
    auVar9._4_4_ = auVar9._0_4_;
    auVar9._8_4_ = auVar9._0_4_;
    auVar9._12_4_ = auVar9._0_4_;
    auVar13 = vblendvps_avx(auVar18,auVar20,auVar9);
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar18 = vrsqrtss_avx(auVar9,auVar9);
    fVar17 = auVar18._0_4_;
    fVar17 = fVar17 * 1.5 - auVar9._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar15._0_4_ = auVar13._0_4_ * fVar17;
    aVar15._4_4_ = auVar13._4_4_ * fVar17;
    aVar15._8_4_ = auVar13._8_4_ * fVar17;
    aVar15._12_4_ = auVar13._12_4_ * fVar17;
    auVar13 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar9 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar26._0_4_ = aVar15._0_4_ * auVar9._0_4_;
    auVar26._4_4_ = aVar15._4_4_ * auVar9._4_4_;
    auVar26._8_4_ = aVar15._8_4_ * auVar9._8_4_;
    auVar26._12_4_ = aVar15._12_4_ * auVar9._12_4_;
    auVar13 = vfmsub231ps_fma(auVar26,auVar10,auVar13);
    auVar18 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar9 = vrsqrtss_avx(auVar13,auVar13);
    fVar17 = auVar9._0_4_;
    fVar17 = fVar17 * 1.5 - auVar13._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
  }
  aVar22._0_4_ = fVar17 * auVar18._0_4_;
  aVar22._4_4_ = fVar17 * auVar18._4_4_;
  aVar22._8_4_ = fVar17 * auVar18._8_4_;
  aVar22._12_4_ = fVar17 * auVar18._12_4_;
LAB_01977091:
  (__return_storage_ptr__->vx).field_0 = aVar15;
  (__return_storage_ptr__->vy).field_0 = aVar22;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }